

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64 drwav_read_pcm_frames_f32(drwav *pWav,drwav_uint64 framesToRead,float *pBufferOut)

{
  long in_RDX;
  drwav *in_RSI;
  long in_RDI;
  float *in_stack_00001000;
  float *in_stack_00001008;
  drwav *in_stack_00001010;
  drwav *in_stack_00001018;
  void *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  if ((in_RDI == 0) || (in_RSI == (drwav *)0x0)) {
    local_8 = 0;
  }
  else if (in_RDX == 0) {
    local_8 = drwav_read_pcm_frames(in_RSI,0,in_stack_ffffffffffffffd8);
  }
  else if (*(short *)(in_RDI + 0x74) == 1) {
    local_8 = drwav_read_pcm_frames_f32__pcm
                        (in_stack_00001018,(drwav_uint64)in_stack_00001010,in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x74) == 2) {
    local_8 = drwav_read_pcm_frames_f32__msadpcm
                        (in_stack_00001010,(drwav_uint64)in_stack_00001008,in_stack_00001000);
  }
  else if (*(short *)(in_RDI + 0x74) == 3) {
    local_8 = drwav_read_pcm_frames_f32__ieee
                        (in_stack_00001018,(drwav_uint64)in_stack_00001010,in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x74) == 6) {
    local_8 = drwav_read_pcm_frames_f32__alaw
                        (in_stack_00001018,(drwav_uint64)in_stack_00001010,in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x74) == 7) {
    local_8 = drwav_read_pcm_frames_f32__mulaw
                        (in_stack_00001018,(drwav_uint64)in_stack_00001010,in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x74) == 0x11) {
    local_8 = drwav_read_pcm_frames_f32__ima
                        (in_stack_00001010,(drwav_uint64)in_stack_00001008,in_stack_00001000);
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_f32(drwav* pWav, drwav_uint64 framesToRead, float* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }

    if (pBufferOut == NULL) {
        return drwav_read_pcm_frames(pWav, framesToRead, NULL);
    }

    /* Don't try to read more samples than can potentially fit in the output buffer. */
    if (framesToRead * pWav->channels * sizeof(float) > DRWAV_SIZE_MAX) {
        framesToRead = DRWAV_SIZE_MAX / sizeof(float) / pWav->channels;
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_PCM) {
        return drwav_read_pcm_frames_f32__pcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        return drwav_read_pcm_frames_f32__msadpcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT) {
        return drwav_read_pcm_frames_f32__ieee(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ALAW) {
        return drwav_read_pcm_frames_f32__alaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_MULAW) {
        return drwav_read_pcm_frames_f32__mulaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        return drwav_read_pcm_frames_f32__ima(pWav, framesToRead, pBufferOut);
    }

    return 0;
}